

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O3

void lws_wsi_mux_sibling_disconnect(lws *wsi)

{
  uint *puVar1;
  lws_log_cx_t *cx;
  lws **pplVar2;
  char *pcVar3;
  lws *plVar4;
  lws *plVar5;
  lws *plVar6;
  
  plVar4 = (wsi->mux).parent_wsi;
  plVar6 = (plVar4->mux).child_list;
  if (plVar6 != (lws *)0x0) {
    if (plVar6 == wsi) {
      pplVar2 = &(plVar4->mux).child_list;
    }
    else {
      do {
        plVar5 = plVar6;
        plVar6 = (plVar5->mux).sibling_list;
        if (plVar6 == (lws *)0x0) goto LAB_001198c8;
      } while (plVar6 != wsi);
      pplVar2 = &(plVar5->mux).sibling_list;
    }
    plVar4 = (plVar6->mux).sibling_list;
    (plVar6->mux).sibling_list = (lws *)0x0;
    *pplVar2 = plVar4;
    cx = (wsi->lc).log_cx;
    if (plVar4 == (lws *)0x0) {
      pcVar3 = "[null wsi]";
    }
    else {
      pcVar3 = lws_lc_tag(&plVar4->lc);
    }
    _lws_log_cx(cx,lws_log_prepend_wsi,wsi,0x10,"lws_wsi_mux_sibling_disconnect",
                " disentangled from sibling %s",pcVar3);
    plVar4 = (wsi->mux).parent_wsi;
  }
LAB_001198c8:
  puVar1 = &(plVar4->mux).child_count;
  *puVar1 = *puVar1 - 1;
  (wsi->mux).parent_wsi = (lws *)0x0;
  return;
}

Assistant:

void
lws_wsi_mux_sibling_disconnect(struct lws *wsi)
{
	struct lws *wsi2;

	lws_start_foreach_llp(struct lws **, w,
			      wsi->mux.parent_wsi->mux.child_list) {

		/* disconnect from siblings */
		if (*w == wsi) {
			wsi2 = (*w)->mux.sibling_list;
			(*w)->mux.sibling_list = NULL;
			*w = wsi2;
			lwsl_wsi_debug(wsi, " disentangled from sibling %s",
					    lws_wsi_tag(wsi2));
			break;
		}
	} lws_end_foreach_llp(w, mux.sibling_list);
	wsi->mux.parent_wsi->mux.child_count--;

	wsi->mux.parent_wsi = NULL;
}